

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool flatbuffers::anon_unknown_0::compareFieldDefs(FieldDef *a,FieldDef *b)

{
  Definition *pDVar1;
  int iVar2;
  char *pcVar3;
  allocator<char> local_79;
  string local_78;
  int b_id;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  FieldDef *pFStack_18;
  int a_id;
  FieldDef *b_local;
  FieldDef *a_local;
  
  pFStack_18 = b;
  b_local = a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"id",&local_41);
  SymbolTable<flatbuffers::Value>::Lookup(&(a->super_Definition).attributes,&local_40);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = atoi(pcVar3);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pDVar1 = &pFStack_18->super_Definition;
  local_1c = iVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"id",&local_79);
  SymbolTable<flatbuffers::Value>::Lookup(&pDVar1->attributes,&local_78);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = atoi(pcVar3);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return local_1c < iVar2;
}

Assistant:

static bool compareFieldDefs(const FieldDef *a, const FieldDef *b) {
  auto a_id = atoi(a->attributes.Lookup("id")->constant.c_str());
  auto b_id = atoi(b->attributes.Lookup("id")->constant.c_str());
  return a_id < b_id;
}